

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Int64(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
        *this,int64_t i)

{
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (this->valid_ != true) {
    return false;
  }
  bVar1 = BeginValue(this);
  if ((bVar1) || ((this->flags_ & 1) != 0)) {
    pcVar2 = (this->schemaStack_).stackTop_;
    if ((ulong)((long)pcVar2 - (long)(this->schemaStack_).stack_) < 0x90) {
      __assert_fail("GetSize() >= sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x98,
                    "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                   );
    }
    this_00 = *(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                **)(pcVar2 + -0x80);
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::CheckInt(this_00,(Context *)(pcVar2 + -0x90),i);
    if (((!bVar1) ||
        (bVar1 = internal::
                 Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 ::CreateParallelValidator(this_00,(Context *)(pcVar2 + -0x90)), !bVar1)) &&
       ((this->flags_ & 1) == 0)) goto LAB_00147583;
    for (pcVar2 = (this->schemaStack_).stack_; pcVar2 != (this->schemaStack_).stackTop_;
        pcVar2 = pcVar2 + 0x90) {
      if (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar2 + 0x38) !=
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0) {
        internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Int64
                  (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar2 + 0x38),i);
      }
      if ((*(long *)(pcVar2 + 0x48) != 0) && (*(int *)(pcVar2 + 0x50) != 0)) {
        uVar3 = 0;
        do {
          Int64((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *)(*(long *)(*(long *)(pcVar2 + 0x48) + uVar3 * 8) + -8),i);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)(pcVar2 + 0x50));
      }
      if ((*(long *)(pcVar2 + 0x58) != 0) && (*(int *)(pcVar2 + 0x60) != 0)) {
        uVar3 = 0;
        do {
          Int64((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *)(*(long *)(*(long *)(pcVar2 + 0x58) + uVar3 * 8) + -8),i);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)(pcVar2 + 0x60));
      }
    }
    bVar1 = EndValue(this);
    if ((bVar1) || ((this->flags_ & 1) != 0)) {
      bVar1 = true;
      goto LAB_00147661;
    }
  }
  else {
LAB_00147583:
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
    *pcVar2 = '\0';
    pcVar2 = (this->documentStack_).stackTop_;
    if (pcVar2 == (this->documentStack_).stack_) {
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x8b,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                   );
    }
    (this->documentStack_).stackTop_ = pcVar2 + -1;
  }
  bVar1 = false;
LAB_00147661:
  this->valid_ = bVar1;
  return bVar1;
}

Assistant:

bool Int64(int64_t i)   { RAPIDJSON_SCHEMA_HANDLE_VALUE_(Int64,  (CurrentContext(), i), (i)); }